

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void NavRestoreLayer(ImGuiNavLayer layer)

{
  ImGuiContext *pIVar1;
  ImGuiWindow *window;
  
  pIVar1 = GImGui;
  GImGui->NavLayer = layer;
  window = pIVar1->NavWindow;
  if (layer == ImGuiNavLayer_Main) {
    if (window->NavLastChildNavWindow != (ImGuiWindow *)0x0) {
      window = window->NavLastChildNavWindow;
    }
    pIVar1->NavWindow = window;
    if (window->NavLastIds[0] != 0) {
      ImGui::SetNavIDWithRectRel(window->NavLastIds[0],0,0,window->NavRectRel);
      return;
    }
  }
  ImGui::NavInitWindow(window,true);
  return;
}

Assistant:

static void NavRestoreLayer(ImGuiNavLayer layer)
{
    ImGuiContext& g = *GImGui;
    g.NavLayer = layer;
    if (layer == 0)
        g.NavWindow = ImGui::NavRestoreLastChildNavWindow(g.NavWindow);
    ImGuiWindow* window = g.NavWindow;
    if (layer == 0 && window->NavLastIds[0] != 0)
        ImGui::SetNavIDWithRectRel(window->NavLastIds[0], layer, 0, window->NavRectRel[0]);
    else
        ImGui::NavInitWindow(window, true);
}